

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O2

void __thiscall spdlog::populators::message_populator::~message_populator(message_populator *this)

{
  pattern_populator::~pattern_populator(&this->super_pattern_populator);
  operator_delete(this);
  return;
}

Assistant:

class SPDLOG_API message_populator : public pattern_populator
{
public:
    message_populator();
}